

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::GenerateImportHeaderCode
          (cmExportFileGenerator *this,ostream *os,string *config)

{
  ostream *poVar1;
  ulong uVar2;
  string *config_local;
  ostream *os_local;
  cmExportFileGenerator *this_local;
  
  poVar1 = std::operator<<(os,"#----------------------------------------------------------------\n")
  ;
  std::operator<<(poVar1,"# Generated CMake target import file");
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar1 = std::operator<<(os," for configuration \"");
    poVar1 = std::operator<<(poVar1,(string *)config);
    std::operator<<(poVar1,"\".\n");
  }
  else {
    std::operator<<(os,".\n");
  }
  poVar1 = std::operator<<(os,"#----------------------------------------------------------------\n")
  ;
  std::operator<<(poVar1,"\n");
  GenerateImportVersionCode(this,os);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateImportHeaderCode(std::ostream& os,
                                                    const std::string& config)
{
  os << "#----------------------------------------------------------------\n"
     << "# Generated CMake target import file";
  if(!config.empty())
    {
    os << " for configuration \"" << config << "\".\n";
    }
  else
    {
    os << ".\n";
    }
  os << "#----------------------------------------------------------------\n"
     << "\n";
  this->GenerateImportVersionCode(os);
}